

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_bf16.h
# Opt level: O1

void ncnn::cast_fp32_to_bf16_sse_avx512bf16(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 (*pauVar1) [32];
  int iVar2;
  bool bVar3;
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined1 (*pauVar10) [64];
  undefined1 (*pauVar11) [32];
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ushort uVar15;
  undefined1 auVar18 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  
  iVar2 = bottom_blob->c;
  if (0 < (long)iVar2) {
    uVar7 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar9 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      pauVar10 = (undefined1 (*) [64])
                 (bottom_blob->cstep * lVar9 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar11 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar9 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar7 < 0x10) {
        uVar13 = 0;
      }
      else {
        iVar12 = 0xf;
        do {
          auVar17 = vcvtneps2bf16_avx512f(*pauVar10);
          *pauVar11 = auVar17;
          pauVar10 = pauVar10 + 1;
          pauVar11 = pauVar11 + 1;
          iVar12 = iVar12 + 0x10;
          uVar13 = uVar7 & 0xfffffff0;
        } while (iVar12 < (int)uVar7);
      }
      uVar8 = uVar13 | 7;
      while ((int)uVar8 < (int)uVar7) {
        auVar16 = vcvtneps2bf16_avx512vl(*(undefined1 (*) [32])*pauVar10);
        *(undefined1 (*) [16])*pauVar11 = auVar16;
        pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x20);
        pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
        uVar8 = uVar13 + 0xf;
        uVar13 = uVar13 + 8;
      }
      if ((int)uVar13 < (int)uVar7) {
        auVar21 = vpbroadcastq_avx512f();
        uVar14 = 0;
        do {
          auVar22 = vpbroadcastq_avx512f();
          auVar23 = vporq_avx512f(auVar22,auVar19);
          auVar22 = vporq_avx512f(auVar22,auVar20);
          uVar4 = vpcmpuq_avx512f(auVar22,auVar21,2);
          bVar5 = (byte)uVar4;
          uVar4 = vpcmpuq_avx512f(auVar23,auVar21,2);
          bVar6 = (byte)uVar4;
          uVar15 = CONCAT11(bVar6,bVar5);
          auVar22 = vmovdqu32_avx512f(*(undefined1 (*) [64])(*pauVar10 + uVar14 * 4));
          auVar23._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar22._4_4_;
          auVar23._0_4_ = (uint)(bVar5 & 1) * auVar22._0_4_;
          auVar23._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar22._8_4_;
          auVar23._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar22._12_4_;
          auVar23._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar22._16_4_;
          auVar23._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar22._20_4_;
          auVar23._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar22._24_4_;
          auVar23._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar22._28_4_;
          auVar23._32_4_ = (uint)(bVar6 & 1) * auVar22._32_4_;
          auVar23._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar22._36_4_;
          auVar23._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar22._40_4_;
          auVar23._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar22._44_4_;
          auVar23._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar22._48_4_;
          auVar23._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar22._52_4_;
          auVar23._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar22._56_4_;
          auVar23._60_4_ = (uint)(bVar6 >> 7) * auVar22._60_4_;
          auVar22 = vpsrld_avx512f(auVar23,0x10);
          pauVar1 = (undefined1 (*) [32])((long)*pauVar11 + uVar14 * 2);
          auVar17 = vpmovdw_avx512f(auVar22);
          auVar18._0_2_ =
               (ushort)(bVar5 & 1) * auVar17._0_2_ | (ushort)!(bool)(bVar5 & 1) * *(short *)*pauVar1
          ;
          bVar3 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar18._2_2_ =
               (ushort)bVar3 * auVar17._2_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 2);
          bVar3 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar18._4_2_ =
               (ushort)bVar3 * auVar17._4_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 4);
          bVar3 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar18._6_2_ =
               (ushort)bVar3 * auVar17._6_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 6);
          bVar3 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar18._8_2_ =
               (ushort)bVar3 * auVar17._8_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 8);
          bVar3 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar18._10_2_ =
               (ushort)bVar3 * auVar17._10_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 10);
          bVar3 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar18._12_2_ =
               (ushort)bVar3 * auVar17._12_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 0xc);
          bVar3 = (bool)((byte)(uVar15 >> 7) & 1);
          auVar18._14_2_ =
               (ushort)bVar3 * auVar17._14_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 0xe);
          auVar18._16_2_ =
               (ushort)(bVar6 & 1) * auVar17._16_2_ |
               (ushort)!(bool)(bVar6 & 1) * *(short *)((long)*pauVar1 + 0x10);
          bVar3 = (bool)(bVar6 >> 1 & 1);
          auVar18._18_2_ =
               (ushort)bVar3 * auVar17._18_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 0x12);
          bVar3 = (bool)(bVar6 >> 2 & 1);
          auVar18._20_2_ =
               (ushort)bVar3 * auVar17._20_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 0x14);
          bVar3 = (bool)(bVar6 >> 3 & 1);
          auVar18._22_2_ =
               (ushort)bVar3 * auVar17._22_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 0x16);
          bVar3 = (bool)(bVar6 >> 4 & 1);
          auVar18._24_2_ =
               (ushort)bVar3 * auVar17._24_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 0x18);
          bVar3 = (bool)(bVar6 >> 5 & 1);
          auVar18._26_2_ =
               (ushort)bVar3 * auVar17._26_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 0x1a);
          bVar3 = (bool)(bVar6 >> 6 & 1);
          auVar18._28_2_ =
               (ushort)bVar3 * auVar17._28_2_ | (ushort)!bVar3 * *(short *)((long)*pauVar1 + 0x1c);
          auVar18._30_2_ =
               (ushort)(bVar6 >> 7) * auVar17._30_2_ |
               (ushort)!(bool)(bVar6 >> 7) * *(short *)((long)*pauVar1 + 0x1e);
          *pauVar1 = auVar18;
          uVar14 = uVar14 + 0x10;
        } while (((ulong)(~uVar13 + uVar7) + 0x10 & 0xfffffffffffffff0) != uVar14);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar2);
  }
  return;
}

Assistant:

static void cast_fp32_to_bf16_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512BF16 && __AVX512F__ && !__AVX512BF16__
    if (ncnn::cpu_support_x86_avx512_bf16())
    {
        cast_fp32_to_bf16_sse_avx512bf16(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        unsigned short* outptr = top_blob.channel(q);

        int i = 0;
#if __AVX512BF16__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v_fp32 = _mm512_loadu_ps(ptr);
            __m256bh _v_bf16 = _mm512_cvtneps_pbh(_v_fp32);
            _mm256_storeu_si256((__m256i*)outptr, (__m256i)_v_bf16);

            ptr += 16;
            outptr += 16;
        }
        for (; i + 7 < size; i += 8)
        {
            __m256 _v_fp32 = _mm256_loadu_ps(ptr);
            __m128bh _v_bf16 = _mm256_cvtneps_pbh(_v_fp32);
            _mm_storeu_si128((__m128i*)outptr, (__m128i)_v_bf16);

            ptr += 8;
            outptr += 8;
        }
#elif __AVX2__
        for (; i + 15 < size; i += 16)
        {
            _mm256_storeu_si256((__m256i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr), _mm256_loadu_ps(ptr + 8)));
            ptr += 16;
            outptr += 16;
        }
        for (; i + 7 < size; i += 8)
        {
            _mm_store_si128((__m128i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr)));
            ptr += 8;
            outptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            *outptr++ = float32_to_bfloat16(*ptr++);
        }
    }
}